

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O0

void __thiscall ASN1Test_StringToUTF8_Test::TestBody(ASN1Test_StringToUTF8_Test *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  initializer_list<unsigned_char> __l_08;
  initializer_list<unsigned_char> __l_09;
  initializer_list<unsigned_char> __l_10;
  initializer_list<unsigned_char> __l_11;
  initializer_list<unsigned_char> __l_12;
  initializer_list<unsigned_char> __l_13;
  initializer_list<unsigned_char> __l_14;
  initializer_list<unsigned_char> __l_15;
  bool bVar1;
  int iVar2;
  ASN1_STRING *__p;
  char *pcVar3;
  pointer paVar4;
  uchar *_data;
  size_type len_s;
  char *in_R9;
  AssertHelper local_340;
  Message local_338;
  Bytes local_330;
  string_view local_320;
  Bytes local_310;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_1;
  Message local_2e8;
  bool local_2da;
  bool local_2d9;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar;
  uint8_t *puStack_2c0;
  int utf8_len;
  uint8_t *utf8;
  AssertHelper local_298;
  Message local_290;
  int local_284;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__1;
  string local_268;
  AssertHelper local_248;
  Message local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_;
  UniquePtr<ASN1_STRING> s;
  undefined1 auStack_218 [7];
  ScopedTrace gtest_trace_918;
  Bytes local_208;
  ScopedTrace local_1f1;
  anon_struct_40_3_dfaa98aa *paStack_1f0;
  ScopedTrace gtest_trace_917;
  anon_struct_40_3_dfaa98aa *test;
  anon_struct_40_3_dfaa98aa *__end1;
  anon_struct_40_3_dfaa98aa *__begin1;
  anon_struct_40_3_dfaa98aa (*__range1) [17];
  iterator local_1c8;
  size_type local_1c0;
  allocator<unsigned_char> local_1b5;
  uchar local_1b4 [4];
  iterator local_1b0;
  size_type local_1a8;
  allocator<unsigned_char> local_19d;
  uchar local_19c [4];
  iterator local_198;
  size_type local_190;
  allocator<unsigned_char> local_185;
  uchar local_184 [4];
  iterator local_180;
  size_type local_178;
  allocator<unsigned_char> local_16d;
  uchar local_16c [4];
  iterator local_168;
  size_type local_160;
  allocator<unsigned_char> local_155;
  uchar local_154 [4];
  iterator local_150;
  size_type local_148;
  allocator<unsigned_char> local_13d;
  uchar local_13c [4];
  iterator local_138;
  size_type local_130;
  allocator<unsigned_char> local_121;
  uchar local_120 [8];
  iterator local_118;
  size_type local_110;
  allocator<unsigned_char> local_105;
  uchar local_104 [4];
  iterator local_100;
  size_type local_f8;
  allocator<unsigned_char> local_e9;
  uchar local_e8 [8];
  iterator local_e0;
  size_type local_d8;
  allocator<unsigned_char> local_cd;
  uchar local_cc [4];
  iterator local_c8;
  size_type local_c0;
  allocator<unsigned_char> local_b4;
  uchar local_b3 [3];
  iterator local_b0;
  size_type local_a8;
  allocator<unsigned_char> local_9c;
  uchar local_9b [3];
  iterator local_98;
  size_type local_90;
  allocator<unsigned_char> local_84;
  uchar local_83 [3];
  iterator local_80;
  size_type local_78;
  allocator<unsigned_char> local_6d;
  uchar local_6c [4];
  iterator local_68;
  size_type local_60;
  allocator<unsigned_char> local_54;
  uchar local_53 [3];
  iterator local_50;
  size_type local_48;
  allocator<unsigned_char> local_2b;
  uchar local_2a [2];
  iterator local_28;
  size_type local_20;
  anon_struct_40_3_dfaa98aa *local_18;
  ASN1Test_StringToUTF8_Test *local_10;
  ASN1Test_StringToUTF8_Test *this_local;
  
  local_10 = this;
  if ((TestBody()::kTests == '\0') && (iVar2 = __cxa_guard_acquire(&TestBody()::kTests), iVar2 != 0)
     ) {
    __range1._5_1_ = 1;
    local_18 = TestBody::kTests;
    local_2a[0] = 0xc0;
    local_2a[1] = 0x81;
    local_28 = local_2a;
    local_20 = 2;
    std::allocator<unsigned_char>::allocator(&local_2b);
    __l_15._M_len = local_20;
    __l_15._M_array = local_28;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0].in,__l_15,&local_2b);
    TestBody::kTests[0].type = 0xc;
    TestBody::kTests[0].expected = (char *)0x0;
    local_18 = (anon_struct_40_3_dfaa98aa *)0xac56d8;
    local_53[0] = 0xe0;
    local_53[1] = 0x80;
    local_53[2] = 0x81;
    local_50 = local_53;
    local_48 = 3;
    std::allocator<unsigned_char>::allocator(&local_54);
    __l_14._M_len = local_48;
    __l_14._M_array = local_50;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[1].in,__l_14,&local_54);
    TestBody::kTests[1].type = 0xc;
    TestBody::kTests[1].expected = (char *)0x0;
    local_18 = (anon_struct_40_3_dfaa98aa *)0xac5700;
    builtin_memcpy(local_6c,"\x01",4);
    local_68 = local_6c;
    local_60 = 4;
    std::allocator<unsigned_char>::allocator(&local_6d);
    __l_13._M_len = local_60;
    __l_13._M_array = local_68;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[2].in,__l_13,&local_6d);
    TestBody::kTests[2].type = 0xc;
    TestBody::kTests[2].expected = (char *)0x0;
    local_18 = (anon_struct_40_3_dfaa98aa *)0xac5728;
    local_83[0] = 0xf0;
    local_83[1] = 0x80;
    local_83[2] = 0x80;
    local_80 = local_83;
    local_78 = 3;
    std::allocator<unsigned_char>::allocator(&local_84);
    __l_12._M_len = local_78;
    __l_12._M_array = local_80;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[3].in,__l_12,&local_84);
    TestBody::kTests[3].type = 0xc;
    TestBody::kTests[3].expected = (char *)0x0;
    local_18 = (anon_struct_40_3_dfaa98aa *)0xac5750;
    local_9b[0] = 0xed;
    local_9b[1] = 0xa0;
    local_9b[2] = 0x80;
    local_98 = local_9b;
    local_90 = 3;
    std::allocator<unsigned_char>::allocator(&local_9c);
    __l_11._M_len = local_90;
    __l_11._M_array = local_98;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[4].in,__l_11,&local_9c);
    TestBody::kTests[4].type = 0xc;
    TestBody::kTests[4].expected = (char *)0x0;
    local_18 = (anon_struct_40_3_dfaa98aa *)0xac5778;
    local_b3[0] = 0xed;
    local_b3[1] = 0xb0;
    local_b3[2] = 0x81;
    local_b0 = local_b3;
    local_a8 = 3;
    std::allocator<unsigned_char>::allocator(&local_b4);
    __l_10._M_len = local_a8;
    __l_10._M_array = local_b0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[5].in,__l_10,&local_b4);
    TestBody::kTests[5].type = 0xc;
    TestBody::kTests[5].expected = (char *)0x0;
    local_18 = (anon_struct_40_3_dfaa98aa *)0xac57a0;
    local_cc[0] = 0xfe;
    local_cc[1] = 0xff;
    local_cc[2] = 0;
    local_cc[3] = 0x58;
    local_c8 = local_cc;
    local_c0 = 4;
    std::allocator<unsigned_char>::allocator(&local_cd);
    __l_09._M_len = local_c0;
    __l_09._M_array = local_c8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[6].in,__l_09,&local_cd);
    TestBody::kTests[6].type = 0x1e;
    TestBody::kTests[6].expected = (char *)0x0;
    local_18 = (anon_struct_40_3_dfaa98aa *)0xac57c8;
    local_e8[0] = '\0';
    local_e8[1] = 0;
    local_e8[2] = 0xfe;
    local_e8[3] = 0xff;
    local_e8[4] = 0;
    local_e8[5] = 0;
    local_e8[6] = 0;
    local_e8[7] = 0x58;
    local_e0 = local_e8;
    local_d8 = 8;
    std::allocator<unsigned_char>::allocator(&local_e9);
    __l_08._M_len = local_d8;
    __l_08._M_array = local_e0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[7].in,__l_08,&local_e9);
    TestBody::kTests[7].type = 0x1c;
    TestBody::kTests[7].expected = (char *)0x0;
    local_18 = (anon_struct_40_3_dfaa98aa *)0xac57f0;
    local_104[0] = '\0';
    local_104[1] = 0x58;
    local_104[2] = 0xfe;
    local_104[3] = 0xff;
    local_100 = local_104;
    local_f8 = 4;
    std::allocator<unsigned_char>::allocator(&local_105);
    __l_07._M_len = local_f8;
    __l_07._M_array = local_100;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[8].in,__l_07,&local_105);
    TestBody::kTests[8].type = 0x1e;
    TestBody::kTests[8].expected = anon_var_dwarf_27dfd;
    local_18 = (anon_struct_40_3_dfaa98aa *)0xac5818;
    local_120[0] = '\0';
    local_120[1] = 0;
    local_120[2] = 0;
    local_120[3] = 0x58;
    local_120[4] = 0;
    local_120[5] = 0;
    local_120[6] = 0xfe;
    local_120[7] = 0xff;
    local_118 = local_120;
    local_110 = 8;
    std::allocator<unsigned_char>::allocator(&local_121);
    __l_06._M_len = local_110;
    __l_06._M_array = local_118;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[9].in,__l_06,&local_121);
    TestBody::kTests[9].type = 0x1c;
    TestBody::kTests[9].expected = anon_var_dwarf_27dfd;
    local_18 = (anon_struct_40_3_dfaa98aa *)0xac5840;
    local_13c[0] = '\0';
    local_13c[1] = 0x10;
    local_13c[2] = 0xff;
    local_13c[3] = 0xfd;
    local_138 = local_13c;
    local_130 = 4;
    std::allocator<unsigned_char>::allocator(&local_13d);
    __l_05._M_len = local_130;
    __l_05._M_array = local_138;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[10].in,__l_05,&local_13d);
    TestBody::kTests[10].type = 0x1c;
    TestBody::kTests[10].expected = anon_var_dwarf_27e0a;
    local_18 = (anon_struct_40_3_dfaa98aa *)0xac5868;
    local_154[0] = '\0';
    local_154[1] = 0x11;
    local_154[2] = 0;
    local_154[3] = 0;
    local_150 = local_154;
    local_148 = 4;
    std::allocator<unsigned_char>::allocator(&local_155);
    __l_04._M_len = local_148;
    __l_04._M_array = local_150;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0xb].in,__l_04,&local_155);
    TestBody::kTests[0xb].type = 0x1c;
    TestBody::kTests[0xb].expected = (char *)0x0;
    local_18 = (anon_struct_40_3_dfaa98aa *)0xac5890;
    local_16c[0] = '\0';
    local_16c[1] = 1;
    local_16c[2] = 0xff;
    local_16c[3] = 0xff;
    local_168 = local_16c;
    local_160 = 4;
    std::allocator<unsigned_char>::allocator(&local_16d);
    __l_03._M_len = local_160;
    __l_03._M_array = local_168;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0xc].in,__l_03,&local_16d);
    TestBody::kTests[0xc].type = 0x1c;
    TestBody::kTests[0xc].expected = (char *)0x0;
    local_18 = (anon_struct_40_3_dfaa98aa *)0xac58b8;
    local_184[0] = '\0';
    local_184[1] = 1;
    local_184[2] = 0xff;
    local_184[3] = 0xfe;
    local_180 = local_184;
    local_178 = 4;
    std::allocator<unsigned_char>::allocator(&local_185);
    __l_02._M_len = local_178;
    __l_02._M_array = local_180;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0xd].in,__l_02,&local_185);
    TestBody::kTests[0xd].type = 0x1c;
    TestBody::kTests[0xd].expected = (char *)0x0;
    local_18 = (anon_struct_40_3_dfaa98aa *)0xac58e0;
    local_19c[0] = '\0';
    local_19c[1] = 0;
    local_19c[2] = 0xfd;
    local_19c[3] = 0xd5;
    local_198 = local_19c;
    local_190 = 4;
    std::allocator<unsigned_char>::allocator(&local_19d);
    __l_01._M_len = local_190;
    __l_01._M_array = local_198;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0xe].in,__l_01,&local_19d);
    TestBody::kTests[0xe].type = 0x1c;
    TestBody::kTests[0xe].expected = (char *)0x0;
    local_18 = (anon_struct_40_3_dfaa98aa *)0xac5908;
    local_1b4[0] = 0xd8;
    local_1b4[1] = 0;
    local_1b4[2] = 0xdc;
    local_1b4[3] = 1;
    local_1b0 = local_1b4;
    local_1a8 = 4;
    std::allocator<unsigned_char>::allocator(&local_1b5);
    __l_00._M_len = local_1a8;
    __l_00._M_array = local_1b0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0xf].in,__l_00,&local_1b5);
    TestBody::kTests[0xf].type = 0x1e;
    TestBody::kTests[0xf].expected = (char *)0x0;
    local_18 = (anon_struct_40_3_dfaa98aa *)0xac5930;
    __range1._7_1_ = 1;
    local_1c8 = (iterator)((long)&__range1 + 7);
    local_1c0 = 1;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&__range1 + 6));
    __l._M_len = local_1c0;
    __l._M_array = local_1c8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0x10].in,__l,(allocator<unsigned_char> *)((long)&__range1 + 6));
    TestBody::kTests[0x10].type = 2;
    TestBody::kTests[0x10].expected = (char *)0x0;
    __range1._5_1_ = 0;
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&__range1 + 6));
    std::allocator<unsigned_char>::~allocator(&local_1b5);
    std::allocator<unsigned_char>::~allocator(&local_19d);
    std::allocator<unsigned_char>::~allocator(&local_185);
    std::allocator<unsigned_char>::~allocator(&local_16d);
    std::allocator<unsigned_char>::~allocator(&local_155);
    std::allocator<unsigned_char>::~allocator(&local_13d);
    std::allocator<unsigned_char>::~allocator(&local_121);
    std::allocator<unsigned_char>::~allocator(&local_105);
    std::allocator<unsigned_char>::~allocator(&local_e9);
    std::allocator<unsigned_char>::~allocator(&local_cd);
    std::allocator<unsigned_char>::~allocator(&local_b4);
    std::allocator<unsigned_char>::~allocator(&local_9c);
    std::allocator<unsigned_char>::~allocator(&local_84);
    std::allocator<unsigned_char>::~allocator(&local_6d);
    std::allocator<unsigned_char>::~allocator(&local_54);
    std::allocator<unsigned_char>::~allocator(&local_2b);
    __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&TestBody()::kTests);
  }
  __end1 = TestBody::kTests;
  while( true ) {
    if (__end1 == (anon_struct_40_3_dfaa98aa *)&TestBody()::kTests) {
      return;
    }
    paStack_1f0 = __end1;
    bssl::Span<unsigned_char_const>::
    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<unsigned_char_const> *)auStack_218,&__end1->in);
    Bytes::Bytes(&local_208,_auStack_218);
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&local_1f1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x395,&local_208);
    testing::ScopedTrace::ScopedTrace<int>
              ((ScopedTrace *)
               ((long)&s._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl + 7),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x396,&paStack_1f0->type);
    __p = ASN1_STRING_type_new(paStack_1f0->type);
    std::unique_ptr<asn1_string_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<asn1_string_st,bssl::internal::Deleter> *)&gtest_ar_.message_,
               (pointer)__p);
    testing::AssertionResult::
    AssertionResult<std::unique_ptr<asn1_string_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_238,
               (unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
               (type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
    if (!bVar1) {
      testing::Message::Message(&local_240);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_268,(internal *)local_238,(AssertionResult *)0x89f7a5,"false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_248,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x398,pcVar3);
      testing::internal::AssertHelper::operator=(&local_248,&local_240);
      testing::internal::AssertHelper::~AssertHelper(&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      testing::Message::~Message(&local_240);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar_.message_
                         );
      _data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&paStack_1f0->in);
      len_s = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&paStack_1f0->in);
      local_284 = ASN1_STRING_set(paVar4,_data,len_s);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_280,&local_284,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
      if (!bVar1) {
        testing::Message::Message(&local_290);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&utf8,(internal *)local_280,
                   (AssertionResult *)"ASN1_STRING_set(s.get(), test.in.data(), test.in.size())",
                   "false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_298,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x399,pcVar3);
        testing::internal::AssertHelper::operator=(&local_298,&local_290);
        testing::internal::AssertHelper::~AssertHelper(&local_298);
        std::__cxx11::string::~string((string *)&utf8);
        testing::Message::~Message(&local_290);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                            &gtest_ar_.message_);
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = ASN1_STRING_to_UTF8(&stack0xfffffffffffffd40,(ASN1_STRING *)paVar4);
        local_2d9 = SUB41((uint)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ >> 0x1f,0);
        local_2da = paStack_1f0->expected == (char *)0x0;
        testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                  ((EqHelper *)local_2d8,"utf8_len < 0","test.expected == nullptr",&local_2d9,
                   &local_2da);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
        if (!bVar1) {
          testing::Message::Message(&local_2e8);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x39d,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_1.message_,&local_2e8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
          testing::Message::~Message(&local_2e8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
        if (gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ < 0) {
          ERR_clear_error();
        }
        else {
          if (paStack_1f0->expected != (char *)0x0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_320,paStack_1f0->expected);
            Bytes::Bytes(&local_310,local_320);
            Bytes::Bytes(&local_330,puStack_2c0,
                         (long)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_);
            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                      ((EqHelper *)local_300,"Bytes(test.expected)","Bytes(utf8, utf8_len)",
                       &local_310,&local_330);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
            if (!bVar1) {
              testing::Message::Message(&local_338);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
              testing::internal::AssertHelper::AssertHelper
                        (&local_340,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,0x3a0,pcVar3);
              testing::internal::AssertHelper::operator=(&local_340,&local_338);
              testing::internal::AssertHelper::~AssertHelper(&local_340);
              testing::Message::~Message(&local_338);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
          }
          OPENSSL_free(puStack_2c0);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = 0;
      }
    }
    std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    testing::ScopedTrace::~ScopedTrace
              ((ScopedTrace *)
               ((long)&s._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl + 7));
    testing::ScopedTrace::~ScopedTrace(&local_1f1);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) break;
    __end1 = __end1 + 1;
  }
  return;
}

Assistant:

TEST(ASN1Test, StringToUTF8) {
  static const struct {
    std::vector<uint8_t> in;
    int type;
    const char *expected;
  } kTests[] = {
      // Non-minimal, two-byte UTF-8.
      {{0xc0, 0x81}, V_ASN1_UTF8STRING, nullptr},
      // Non-minimal, three-byte UTF-8.
      {{0xe0, 0x80, 0x81}, V_ASN1_UTF8STRING, nullptr},
      // Non-minimal, four-byte UTF-8.
      {{0xf0, 0x80, 0x80, 0x81}, V_ASN1_UTF8STRING, nullptr},
      // Truncated, four-byte UTF-8.
      {{0xf0, 0x80, 0x80}, V_ASN1_UTF8STRING, nullptr},
      // Low-surrogate value.
      {{0xed, 0xa0, 0x80}, V_ASN1_UTF8STRING, nullptr},
      // High-surrogate value.
      {{0xed, 0xb0, 0x81}, V_ASN1_UTF8STRING, nullptr},
      // Initial BOMs should be rejected from UCS-2 and UCS-4.
      {{0xfe, 0xff, 0, 88}, V_ASN1_BMPSTRING, nullptr},
      {{0, 0, 0xfe, 0xff, 0, 0, 0, 88}, V_ASN1_UNIVERSALSTRING, nullptr},
      // Otherwise, BOMs should pass through.
      {{0, 88, 0xfe, 0xff}, V_ASN1_BMPSTRING, "X\xef\xbb\xbf"},
      {{0, 0, 0, 88, 0, 0, 0xfe, 0xff},
       V_ASN1_UNIVERSALSTRING,
       "X\xef\xbb\xbf"},
      // The maximum code-point should pass though.
      {{0, 16, 0xff, 0xfd}, V_ASN1_UNIVERSALSTRING, "\xf4\x8f\xbf\xbd"},
      // Values outside the Unicode space should not.
      {{0, 17, 0, 0}, V_ASN1_UNIVERSALSTRING, nullptr},
      // Non-characters should be rejected.
      {{0, 1, 0xff, 0xff}, V_ASN1_UNIVERSALSTRING, nullptr},
      {{0, 1, 0xff, 0xfe}, V_ASN1_UNIVERSALSTRING, nullptr},
      {{0, 0, 0xfd, 0xd5}, V_ASN1_UNIVERSALSTRING, nullptr},
      // BMPString is UCS-2, not UTF-16, so surrogate pairs are invalid.
      {{0xd8, 0, 0xdc, 1}, V_ASN1_BMPSTRING, nullptr},
      // INTEGERs are stored as strings, but cannot be converted to UTF-8.
      {{0x01}, V_ASN1_INTEGER, nullptr},
  };

  for (const auto &test : kTests) {
    SCOPED_TRACE(Bytes(test.in));
    SCOPED_TRACE(test.type);
    bssl::UniquePtr<ASN1_STRING> s(ASN1_STRING_type_new(test.type));
    ASSERT_TRUE(s);
    ASSERT_TRUE(ASN1_STRING_set(s.get(), test.in.data(), test.in.size()));

    uint8_t *utf8;
    const int utf8_len = ASN1_STRING_to_UTF8(&utf8, s.get());
    EXPECT_EQ(utf8_len < 0, test.expected == nullptr);
    if (utf8_len >= 0) {
      if (test.expected != nullptr) {
        EXPECT_EQ(Bytes(test.expected), Bytes(utf8, utf8_len));
      }
      OPENSSL_free(utf8);
    } else {
      ERR_clear_error();
    }
  }
}